

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_print_integer.c
# Opt level: O0

void intformat(intmax_t value,_PDCLIB_status_t *status)

{
  char cVar1;
  unsigned_long local_68;
  size_t local_58;
  int character_3;
  int character_2;
  int character_1;
  int character;
  size_t i;
  size_t characters;
  size_t prec_pads;
  size_t preidx;
  _PDCLIB_status_t *p_Stack_18;
  char preface [3];
  _PDCLIB_status_t *status_local;
  intmax_t value_local;
  
  p_Stack_18 = status;
  memset((void *)((long)&preidx + 5),0,3);
  prec_pads = 0;
  if (p_Stack_18->prec < 0) {
    p_Stack_18->prec = 1;
  }
  if (((p_Stack_18->flags & 4U) != 0) &&
     (((p_Stack_18->base == 0x10 || (p_Stack_18->base == 8)) && (value != 0)))) {
    prec_pads = 1;
    preidx._5_1_ = 0x30;
    if (p_Stack_18->base == 0x10) {
      preidx._6_1_ = 0x58;
      if ((p_Stack_18->flags & 0x10000U) != 0) {
        preidx._6_1_ = 0x78;
      }
      prec_pads = 2;
    }
  }
  if (value < 0) {
    *(undefined1 *)((long)&preidx + prec_pads + 5) = 0x2d;
    prec_pads = prec_pads + 1;
  }
  else if ((p_Stack_18->flags & 0x20000U) == 0) {
    if ((p_Stack_18->flags & 2U) == 0) {
      if ((p_Stack_18->flags & 8U) != 0) {
        *(undefined1 *)((long)&preidx + prec_pads + 5) = 0x20;
        prec_pads = prec_pads + 1;
      }
    }
    else {
      *(undefined1 *)((long)&preidx + prec_pads + 5) = 0x2b;
      prec_pads = prec_pads + 1;
    }
  }
  if (p_Stack_18->current < (ulong)(long)p_Stack_18->prec) {
    local_58 = (long)p_Stack_18->prec - p_Stack_18->current;
  }
  else {
    local_58 = 0;
  }
  characters = local_58;
  if ((p_Stack_18->flags & 0x11U) == 0) {
    if ((ulong)(long)p_Stack_18->prec < p_Stack_18->current) {
      local_68 = p_Stack_18->current;
    }
    else {
      local_68 = (unsigned_long)p_Stack_18->prec;
    }
    if (prec_pads + local_68 < p_Stack_18->width) {
      for (_character_1 = 0; _character_1 < p_Stack_18->width - (prec_pads + local_68);
          _character_1 = _character_1 + 1) {
        if (p_Stack_18->i < p_Stack_18->n) {
          if (p_Stack_18->stream == (_PDCLIB_file_t *)0x0) {
            p_Stack_18->s[p_Stack_18->i] = ' ';
          }
          else {
            putc(0x20,(FILE *)p_Stack_18->stream);
          }
        }
        p_Stack_18->i = p_Stack_18->i + 1;
        p_Stack_18->current = p_Stack_18->current + 1;
      }
    }
  }
  prec_pads = 0;
  while (*(char *)((long)&preidx + prec_pads + 5) != '\0') {
    cVar1 = *(char *)((long)&preidx + prec_pads + 5);
    if (p_Stack_18->i < p_Stack_18->n) {
      if (p_Stack_18->stream == (_PDCLIB_file_t *)0x0) {
        p_Stack_18->s[p_Stack_18->i] = cVar1;
      }
      else {
        putc((int)cVar1,(FILE *)p_Stack_18->stream);
      }
    }
    p_Stack_18->i = p_Stack_18->i + 1;
    p_Stack_18->current = p_Stack_18->current + 1;
    prec_pads = prec_pads + 1;
  }
  while (characters != 0) {
    if (p_Stack_18->i < p_Stack_18->n) {
      if (p_Stack_18->stream == (_PDCLIB_file_t *)0x0) {
        p_Stack_18->s[p_Stack_18->i] = '0';
      }
      else {
        putc(0x30,(FILE *)p_Stack_18->stream);
      }
    }
    p_Stack_18->i = p_Stack_18->i + 1;
    p_Stack_18->current = p_Stack_18->current + 1;
    characters = characters - 1;
  }
  if (((p_Stack_18->flags & 1U) == 0) && ((p_Stack_18->flags & 0x10U) != 0)) {
    while (p_Stack_18->current < p_Stack_18->width) {
      if (p_Stack_18->i < p_Stack_18->n) {
        if (p_Stack_18->stream == (_PDCLIB_file_t *)0x0) {
          p_Stack_18->s[p_Stack_18->i] = '0';
        }
        else {
          putc(0x30,(FILE *)p_Stack_18->stream);
        }
      }
      p_Stack_18->i = p_Stack_18->i + 1;
      p_Stack_18->current = p_Stack_18->current + 1;
    }
  }
  return;
}

Assistant:

static void intformat( intmax_t value, struct _PDCLIB_status_t * status )
{
    /* At worst, we need two prefix characters (hex prefix). */
    char preface[3] = "\0";
    size_t preidx = 0;

    if ( status->prec < 0 )
    {
        status->prec = 1;
    }

    if ( ( status->flags & E_alt ) && ( status->base == 16 || status->base == 8 ) && ( value != 0 ) )
    {
        /* Octal / hexadecimal prefix for "%#" conversions */
        preface[ preidx++ ] = '0';

        if ( status->base == 16 )
        {
            preface[ preidx++ ] = ( status->flags & E_lower ) ? 'x' : 'X';
        }
    }

    if ( value < 0 )
    {
        /* Negative sign for negative values - at all times. */
        preface[ preidx++ ] = '-';
    }
    else if ( !( status->flags & E_unsigned ) )
    {
        /* plus sign / extra space are only for signed conversions */
        if ( status->flags & E_plus )
        {
            preface[ preidx++ ] = '+';
        }
        else
        {
            if ( status->flags & E_space )
            {
                preface[ preidx++ ] = ' ';
            }
        }
    }

    {
        /* At this point, status->current has the number of digits queued up.
           Determine if we have a precision requirement to pad those.
        */
        size_t prec_pads = ( ( _PDCLIB_size_t )status->prec > status->current ) ? ( ( _PDCLIB_size_t )status->prec - status->current ) : 0;

        if ( !( status->flags & ( E_minus | E_zero ) ) )
        {
            /* Space padding is only done if no zero padding or left alignment
               is requested. Calculate the number of characters that WILL be
               printed, including any prefixes determined above.
            */
            /* The number of characters to be printed, plus prefixes if any. */
            /* This line contained probably the most stupid, time-wasting bug
               I've ever perpetrated. Greetings to Samface, DevL, and all
               sceners at Breakpoint 2006.
            */
            size_t characters = preidx + ( ( status->current > ( _PDCLIB_size_t )status->prec ) ? status->current : ( _PDCLIB_size_t )status->prec );

            if ( status->width > characters )
            {
                size_t i;

                for ( i = 0; i < status->width - characters; ++i )
                {
                    PUT( ' ' );
                    ++( status->current );
                }
            }
        }

        /* Now we did the padding, do the prefixes (if any). */
        preidx = 0;

        while ( preface[ preidx ] != '\0' )
        {
            PUT( preface[ preidx++ ] );
            ++( status->current );
        }

        /* Do the precision padding if necessary. */
        while ( prec_pads-- > 0 )
        {
            PUT( '0' );
            ++( status->current );
        }

        if ( ( !( status->flags & E_minus ) ) && ( status->flags & E_zero ) )
        {
            /* If field is not left aligned, and zero padding is requested, do
               so.
            */
            while ( status->current < status->width )
            {
                PUT( '0' );
                ++( status->current );
            }
        }
    }
}